

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O2

void mathCore::dual(expression *a)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = is_literal(a);
  if (bVar2) {
    uVar1 = 4;
  }
  else {
    bVar2 = is_var(a);
    if (bVar2) {
      return;
    }
    uVar1 = 8;
  }
  a->FLAGS = a->FLAGS ^ uVar1;
  return;
}

Assistant:

void mathCore::dual(expression* a) {
	if (mathCore::is_literal(a)) {
		// Dual of a Literal is its negation
		mathCore::negate(a);
	}
	else if (!mathCore::is_var(a)){
		// If its not a varible you flip its dual
		a->FLAGS ^= F_DUAL;
	}
}